

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_gAMA(ucvector *out,LodePNGInfo *info)

{
  uchar *__ptr;
  uint uVar1;
  uint extraout_EAX;
  ucvector data;
  ucvector local_38;
  
  local_38.data = (uchar *)0x0;
  local_38.size = 0;
  local_38.allocsize = 0;
  lodepng_add32bitInt(&local_38,info->gama_gamma);
  __ptr = local_38.data;
  uVar1 = lodepng_chunk_create(&out->data,&out->size,(uint)local_38.size,"gAMA",local_38.data);
  if (uVar1 == 0) {
    out->allocsize = out->size;
  }
  local_38.size = 0;
  local_38.allocsize = 0;
  free(__ptr);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_gAMA(ucvector* out, const LodePNGInfo* info) {
  unsigned error = 0;
  ucvector data;
  ucvector_init(&data);

  lodepng_add32bitInt(&data, info->gama_gamma);

  error = addChunk(out, "gAMA", data.data, data.size);
  ucvector_cleanup(&data);

  return error;
}